

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O1

void __thiscall sf::priv::GlxContext::display(GlxContext *this)

{
  GLXDrawable GVar1;
  
  GVar1 = this->m_pbuffer;
  if ((GVar1 == 0) && (GVar1 = this->m_window, GVar1 == 0)) {
    return;
  }
  (*sf_glad_glXSwapBuffers)(this->m_display,GVar1);
  return;
}

Assistant:

void GlxContext::display()
{
#if defined(GLX_DEBUGGING)
    GlxErrorHandler handler(m_display);
#endif

    if (m_pbuffer)
        glXSwapBuffers(m_display, m_pbuffer);
    else if (m_window)
        glXSwapBuffers(m_display, m_window);

#if defined(GLX_DEBUGGING)
    if (glxErrorOccurred)
        err() << "GLX error in GlxContext::display()" << std::endl;
#endif
}